

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  int iVar7;
  ImU32 IVar8;
  uint uVar9;
  GetterXsYRef<unsigned_long_long> *pGVar10;
  GetterXsYRef<unsigned_long_long> *pGVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  double dVar14;
  double dVar15;
  ImDrawIdx IVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pGVar10 = this->Getter1;
  pGVar11 = this->Getter2;
  iVar6 = pGVar10->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar10->Xs +
           (long)(((pGVar10->Offset + prim) % iVar6 + iVar6) % iVar6) * (long)pGVar10->Stride);
  iVar6 = this->Transformer->YAxis;
  dVar14 = (double)GImPlot->PixelRange[iVar6].Min.x;
  dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar24 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) - dVar3) *
                   GImPlot->Mx + dVar14);
  dVar15 = (double)GImPlot->PixelRange[iVar6].Min.y;
  dVar4 = GImPlot->CurrentPlot->YAxis[iVar6].Range.Min;
  fVar25 = (float)((pGVar10->YRef - dVar4) * GImPlot->My[iVar6] + dVar15);
  iVar7 = pGVar11->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar11->Xs +
           (long)(((prim + pGVar11->Offset) % iVar7 + iVar7) % iVar7) * (long)pGVar11->Stride);
  fVar19 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) - dVar3) *
                   GImPlot->Mx + dVar14);
  fVar20 = (float)((pGVar11->YRef - dVar4) * GImPlot->My[iVar6] + dVar15);
  fVar22 = fVar25;
  if (fVar20 <= fVar25) {
    fVar22 = fVar20;
  }
  bVar17 = false;
  if ((fVar22 < (cull_rect->Max).y) &&
     (fVar22 = (float)(~-(uint)(fVar20 <= fVar25) & (uint)fVar20 |
                      -(uint)(fVar20 <= fVar25) & (uint)fVar25), pfVar1 = &(cull_rect->Min).y,
     bVar17 = false, *pfVar1 <= fVar22 && fVar22 != *pfVar1)) {
    fVar22 = fVar24;
    if (fVar19 <= fVar24) {
      fVar22 = fVar19;
    }
    if (fVar22 < (cull_rect->Max).x) {
      fVar22 = (float)(~-(uint)(fVar19 <= fVar24) & (uint)fVar19 |
                      -(uint)(fVar19 <= fVar24) & (uint)fVar24);
      bVar17 = (cull_rect->Min).x <= fVar22 && fVar22 != (cull_rect->Min).x;
    }
  }
  if (bVar17 != false) {
    fVar22 = this->Weight;
    IVar8 = this->Col;
    IVar5 = *uv;
    fVar21 = fVar19 - fVar24;
    fVar23 = fVar20 - fVar25;
    fVar18 = fVar21 * fVar21 + fVar23 * fVar23;
    if (0.0 < fVar18) {
      if (fVar18 < 0.0) {
        fVar18 = sqrtf(fVar18);
      }
      else {
        fVar18 = SQRT(fVar18);
      }
      fVar21 = fVar21 * (1.0 / fVar18);
      fVar23 = fVar23 * (1.0 / fVar18);
    }
    fVar22 = fVar22 * 0.5;
    fVar21 = fVar21 * fVar22;
    fVar22 = fVar22 * fVar23;
    pIVar12 = DrawList->_VtxWritePtr;
    (pIVar12->pos).x = fVar22 + fVar24;
    (pIVar12->pos).y = fVar25 - fVar21;
    pIVar12->uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar8;
    pIVar12[1].pos.x = fVar22 + fVar19;
    pIVar12[1].pos.y = fVar20 - fVar21;
    pIVar12[1].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar8;
    pIVar12[2].pos.x = fVar19 - fVar22;
    pIVar12[2].pos.y = fVar21 + fVar20;
    pIVar12[2].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar8;
    pIVar12[3].pos.x = fVar24 - fVar22;
    pIVar12[3].pos.y = fVar21 + fVar25;
    pIVar12[3].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar9 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar9;
    *pIVar13 = IVar16;
    pIVar13[1] = IVar16 + 1;
    pIVar13[2] = IVar16 + 2;
    pIVar13[3] = IVar16;
    pIVar13[4] = IVar16 + 2;
    pIVar13[5] = IVar16 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar9 + 4;
  }
  return bVar17;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }